

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O2

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Value(ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
        *this)

{
  bool bVar1;
  bool bVar2;
  Depth_Counter dc;
  allocator<char> local_39;
  Depth_Counter local_38;
  string local_30;
  
  Depth_Counter::Depth_Counter(&local_38,this);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_39);
  bVar1 = Var_Decl(this,false,&local_30);
  bVar2 = true;
  if (!bVar1) {
    bVar1 = Dot_Fun_Array(this);
    if (!bVar1) {
      bVar2 = Prefix(this);
    }
  }
  std::__cxx11::string::~string((string *)&local_30);
  (local_38.parser)->m_current_parse_depth = (local_38.parser)->m_current_parse_depth - 1;
  return bVar2;
}

Assistant:

bool Value() {
        Depth_Counter dc{this};
        return Var_Decl() || Dot_Fun_Array() || Prefix();
      }